

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

int Vec_IntPushUnique(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  
  piVar2 = (int *)(long)p->nSize;
  if (0 < (long)piVar2) {
    piVar3 = (int *)0x0;
    do {
      if (p->pArray[(long)piVar3] == Entry) goto LAB_0044f7f3;
      piVar3 = (int *)((long)piVar3 + 1);
    } while (piVar2 != piVar3);
  }
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar2 = (int *)malloc(0x40);
      }
      else {
        piVar2 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar2;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_0044f7e1;
      if (p->pArray == (int *)0x0) {
        piVar2 = (int *)malloc((ulong)uVar1 << 3);
      }
      else {
        piVar2 = (int *)realloc(p->pArray,(ulong)uVar1 << 3);
      }
      p->pArray = piVar2;
    }
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = iVar4;
  }
LAB_0044f7e1:
  piVar2 = p->pArray;
  iVar4 = p->nSize;
  p->nSize = iVar4 + 1;
  piVar2[iVar4] = Entry;
LAB_0044f7f3:
  return (int)piVar2;
}

Assistant:

static inline int Vec_IntPushUnique( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPush( p, Entry );
    return 0;
}